

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O0

void ProcessRow_SSE2(__m128i *A0,__m128i *A1,__m128i *A2,__m128i *A3,__m128i *mult,uint8_t *dst)

{
  undefined1 auVar1 [16];
  ulong *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  ulong *in_R8;
  undefined8 *in_R9;
  undefined1 auVar2 [16];
  __m128i C3;
  __m128i C2;
  __m128i C1;
  __m128i C0;
  __m128i B3;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i mask;
  __m128i rounder;
  __m128i G;
  __m128i F;
  __m128i E1;
  __m128i E0;
  __m128i D3;
  __m128i D2;
  __m128i D1;
  __m128i D0;
  
  auVar1._8_8_ = (in_RDI[1] & 0xffffffff) * (in_R8[1] & 0xffffffff) + 0x80000000 >> 0x20 |
                 (in_RDX[1] & 0xffffffff) * (in_R8[1] & 0xffffffff) + 0x80000000 &
                 0xffffffff00000000;
  auVar1._0_8_ = (*in_RDI & 0xffffffff) * (*in_R8 & 0xffffffff) + 0x80000000 >> 0x20 |
                 (*in_RDX & 0xffffffff) * (*in_R8 & 0xffffffff) + 0x80000000 & 0xffffffff00000000;
  auVar2._8_8_ = (in_RSI[1] & 0xffffffff) * (in_R8[1] & 0xffffffff) + 0x80000000 >> 0x20 |
                 (in_RCX[1] & 0xffffffff) * (in_R8[1] & 0xffffffff) + 0x80000000 &
                 0xffffffff00000000;
  auVar2._0_8_ = (*in_RSI & 0xffffffff) * (*in_R8 & 0xffffffff) + 0x80000000 >> 0x20 |
                 (*in_RCX & 0xffffffff) * (*in_R8 & 0xffffffff) + 0x80000000 & 0xffffffff00000000;
  auVar2 = packssdw(auVar1,auVar2);
  D2[1]._0_2_ = auVar2._0_2_;
  D2[1]._2_2_ = auVar2._2_2_;
  D2[1]._4_2_ = auVar2._4_2_;
  D2[1]._6_2_ = auVar2._6_2_;
  D1[0]._0_2_ = auVar2._8_2_;
  D1[0]._2_2_ = auVar2._10_2_;
  D1[0]._4_2_ = auVar2._12_2_;
  D1[0]._6_2_ = auVar2._14_2_;
  *in_R9 = CONCAT17((0 < D1[0]._6_2_) * (D1[0]._6_2_ < 0x100) * auVar2[0xe] - (0xff < D1[0]._6_2_),
                    CONCAT16((0 < D1[0]._4_2_) * (D1[0]._4_2_ < 0x100) * auVar2[0xc] -
                             (0xff < D1[0]._4_2_),
                             CONCAT15((0 < D1[0]._2_2_) * (D1[0]._2_2_ < 0x100) * auVar2[10] -
                                      (0xff < D1[0]._2_2_),
                                      CONCAT14((0 < (short)D1[0]) * ((short)D1[0] < 0x100) *
                                               auVar2[8] - (0xff < (short)D1[0]),
                                               CONCAT13((0 < D2[1]._6_2_) * (D2[1]._6_2_ < 0x100) *
                                                        auVar2[6] - (0xff < D2[1]._6_2_),
                                                        CONCAT12((0 < D2[1]._4_2_) *
                                                                 (D2[1]._4_2_ < 0x100) * auVar2[4] -
                                                                 (0xff < D2[1]._4_2_),
                                                                 CONCAT11((0 < D2[1]._2_2_) *
                                                                          (D2[1]._2_2_ < 0x100) *
                                                                          auVar2[2] -
                                                                          (0xff < D2[1]._2_2_),
                                                                          (0 < (short)D2[1]) *
                                                                          ((short)D2[1] < 0x100) *
                                                                          auVar2[0] -
                                                                          (0xff < (short)D2[1]))))))
                            ));
  return;
}

Assistant:

static WEBP_INLINE void ProcessRow_SSE2(const __m128i* const A0,
                                        const __m128i* const A1,
                                        const __m128i* const A2,
                                        const __m128i* const A3,
                                        const __m128i* const mult,
                                        uint8_t* const dst) {
  const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
  const __m128i mask = _mm_set_epi32(~0, 0, ~0, 0);
  const __m128i B0 = _mm_mul_epu32(*A0, *mult);
  const __m128i B1 = _mm_mul_epu32(*A1, *mult);
  const __m128i B2 = _mm_mul_epu32(*A2, *mult);
  const __m128i B3 = _mm_mul_epu32(*A3, *mult);
  const __m128i C0 = _mm_add_epi64(B0, rounder);
  const __m128i C1 = _mm_add_epi64(B1, rounder);
  const __m128i C2 = _mm_add_epi64(B2, rounder);
  const __m128i C3 = _mm_add_epi64(B3, rounder);
  const __m128i D0 = _mm_srli_epi64(C0, WEBP_RESCALER_RFIX);
  const __m128i D1 = _mm_srli_epi64(C1, WEBP_RESCALER_RFIX);
#if (WEBP_RESCALER_RFIX < 32)
  const __m128i D2 =
      _mm_and_si128(_mm_slli_epi64(C2, 32 - WEBP_RESCALER_RFIX), mask);
  const __m128i D3 =
      _mm_and_si128(_mm_slli_epi64(C3, 32 - WEBP_RESCALER_RFIX), mask);
#else
  const __m128i D2 = _mm_and_si128(C2, mask);
  const __m128i D3 = _mm_and_si128(C3, mask);
#endif
  const __m128i E0 = _mm_or_si128(D0, D2);
  const __m128i E1 = _mm_or_si128(D1, D3);
  const __m128i F = _mm_packs_epi32(E0, E1);
  const __m128i G = _mm_packus_epi16(F, F);
  _mm_storel_epi64((__m128i*)dst, G);
}